

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprpc.cpp
# Opt level: O0

void __thiscall mprpc::MpRpcClient::on_recv(MpRpcClient *this,char *data,size_t size)

{
  bool bVar1;
  element_type *peVar2;
  MessageLoop *this_00;
  anon_class_24_2_51bc3777 local_88;
  Closure local_70;
  rep local_40;
  uint local_34;
  undefined1 local_30 [8];
  shared_ptr<mprpc::MpRpcMessage> rpcmsg;
  size_t size_local;
  char *data_local;
  MpRpcClient *this_local;
  
  rpcmsg.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)size;
  MpRpcMessage::parse((MpRpcMessage *)local_30,data,size);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
  if (bVar1) {
    local_40 = std::chrono::_V2::system_clock::now();
    peVar2 = std::__shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
    (peVar2->recv_time).__d.__r = local_40;
    this_00 = loop::MsgLoopRun::msg_loop(&this->super_MsgLoopRun);
    local_88.this = this;
    std::shared_ptr<mprpc::MpRpcMessage>::shared_ptr
              (&local_88.rpcmsg,(shared_ptr<mprpc::MpRpcMessage> *)local_30);
    std::function<void()>::
    function<mprpc::MpRpcClient::on_recv(char_const*,unsigned_long)::__0,void>
              ((function<void()> *)&local_70,&local_88);
    loop::MessageLoop::post_task(this_00,&local_70);
    std::function<void_()>::~function(&local_70);
    on_recv(char_const*,unsigned_long)::$_0::~__0((__0 *)&local_88);
  }
  local_34 = (uint)!bVar1;
  std::shared_ptr<mprpc::MpRpcMessage>::~shared_ptr((shared_ptr<mprpc::MpRpcMessage> *)local_30);
  return;
}

Assistant:

void MpRpcClient::on_recv(const char* data, size_t size)
    {
        shared_ptr<MpRpcMessage> rpcmsg = MpRpcMessage::parse(data, size);
        if (!rpcmsg) return;

        rpcmsg->recv_time = system_clock::now();

        msg_loop().post_task([this, rpcmsg]() {
            if (rpcmsg->method == ".sys.heartbeat") {

                m_last_hb_rsp_time = system_clock::now();

                if (!m_connected) {
                    m_connected = true;
                    if (m_callback) m_callback->on_connected();
                }
                if (m_callback) m_callback->on_notification(rpcmsg);
            }
            else if (rpcmsg->id) {
                auto it = m_on_rsp_map.find(rpcmsg->id);
                if (it != m_on_rsp_map.end()) {
                    auto rsp = it->second.promise;
                    m_on_rsp_map.erase(it);
                    rsp->set_value(rpcmsg);
                }
            }
            else {
                // Notification message
                if (m_callback && !rpcmsg->method.empty())
                    m_callback->on_notification(rpcmsg);
            }
        });
    }